

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_string_vector.cc
# Opt level: O2

void __thiscall s2coding::StringVectorEncoder::Encode(StringVectorEncoder *this,Encoder *encoder)

{
  Encoder *this_00;
  uchar *__src;
  size_t sVar1;
  Encoder *in_RCX;
  Span<unsigned_long_long> SVar2;
  Span<const_unsigned_long_long> v;
  size_t local_20;
  
  this_00 = &this->data_;
  local_20 = Encoder::length(this_00);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
  emplace_back<unsigned_long_long>(&this->offsets_,&local_20);
  SVar2 = absl::MakeSpan<unsigned_long_long>
                    ((this->offsets_).
                     super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1,
                     (this->offsets_).
                     super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  v.len_ = (size_type)encoder;
  v.ptr_ = (pointer)SVar2.len_;
  EncodeUintVector<unsigned_long_long>((s2coding *)SVar2.ptr_,v,in_RCX);
  sVar1 = Encoder::length(this_00);
  Encoder::Ensure(encoder,sVar1);
  __src = (this->data_).orig_;
  sVar1 = Encoder::length(this_00);
  memcpy(encoder->buf_,__src,sVar1);
  encoder->buf_ = encoder->buf_ + sVar1;
  return;
}

Assistant:

void StringVectorEncoder::Encode(Encoder* encoder) {
  offsets_.push_back(data_.length());
  // We don't encode the first element of "offsets_", which is always zero.
  EncodeUintVector<uint64>(
      MakeSpan(offsets_.data() + 1, offsets_.data() + offsets_.size()),
      encoder);
  encoder->Ensure(data_.length());
  encoder->putn(data_.base(), data_.length());
}